

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall FixedVssInstance::enforceBoundaryConstraints(FixedVssInstance *this)

{
  bool bVar1;
  uint uVar2;
  ast_vector_tpl<z3::expr> *in_RDI;
  size_t vertex;
  int in_stack_ffffffffffffff7c;
  Graph *in_stack_ffffffffffffff80;
  expr *in_stack_ffffffffffffff88;
  optimize *in_stack_ffffffffffffff90;
  expr *in_stack_ffffffffffffff98;
  ulong uVar3;
  int i;
  expr local_50 [3];
  expr local_20;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    uVar3 = local_10;
    uVar2 = z3::ast_vector_tpl<z3::expr>::size
                      ((ast_vector_tpl<z3::expr> *)in_stack_ffffffffffffff80);
    if (uVar2 <= uVar3) break;
    bVar1 = Graph::isBoundary(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    i = (int)(uVar3 >> 0x20);
    if (bVar1) {
      in_stack_ffffffffffffff90 = (optimize *)&in_RDI[0x14].m_vector;
      in_stack_ffffffffffffff98 = &local_20;
      z3::ast_vector_tpl<z3::expr>::operator[](in_RDI,i);
      z3::optimize::add(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      z3::expr::~expr((expr *)0x1081f5);
    }
    else {
      in_stack_ffffffffffffff80 = (Graph *)&in_RDI[0x14].m_vector;
      in_stack_ffffffffffffff88 = local_50;
      z3::ast_vector_tpl<z3::expr>::operator[](in_RDI,i);
      z3::operator!(in_stack_ffffffffffffff98);
      z3::optimize::add(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      z3::expr::~expr((expr *)0x108270);
      z3::expr::~expr((expr *)0x10827a);
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void FixedVssInstance::enforceBoundaryConstraints() {
  for (size_t vertex = 0; vertex < borderVars.size(); vertex++) {

    if (graph.isBoundary(vertex)) {
      solver.add(borderVars[vertex]);
    } else {
      solver.add(!borderVars[vertex]);
    }
  }
}